

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.h
# Opt level: O2

void __thiscall
cmDocumentation::SetSection<cmDocumentationEntry>
          (cmDocumentation *this,char *sectionName,cmDocumentationEntry *docs)

{
  cmDocumentationSection sec;
  cmDocumentationSection cStack_88;
  cmDocumentationSection local_50;
  
  cmDocumentationSection::cmDocumentationSection(&cStack_88,sectionName);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
            (&cStack_88.Entries,docs);
  cmDocumentationSection::cmDocumentationSection(&local_50,&cStack_88);
  SetSection(this,sectionName,&local_50);
  cmDocumentationSection::~cmDocumentationSection(&local_50);
  cmDocumentationSection::~cmDocumentationSection(&cStack_88);
  return;
}

Assistant:

void SetSection(const char* sectionName, const Iterable& docs)
  {
    cmDocumentationSection sec{ sectionName };
    sec.Append(docs);
    this->SetSection(sectionName, std::move(sec));
  }